

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O1

asn_enc_rval_t *
INTEGER_encode_der(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,
                  int tag_mode,ber_tlv_tag_t tag,asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar2 = *sptr;
  if (pcVar2 != (char *)0x0) {
    iVar4 = *(int *)((long)sptr + 8);
    pcVar3 = pcVar2;
    if (pcVar2 < pcVar2 + (long)iVar4 + -1) {
      lVar6 = (long)iVar4 + -1;
      pcVar5 = pcVar2;
      do {
        pcVar3 = pcVar5;
        if (*pcVar3 == -1) {
          if (-1 < pcVar3[1]) break;
        }
        else if ((*pcVar3 != '\0') || (pcVar3[1] < '\0')) break;
        pcVar5 = pcVar3 + 1;
        lVar6 = lVar6 + -1;
        pcVar3 = pcVar2 + (long)iVar4 + -1;
      } while (lVar6 != 0);
    }
    iVar1 = (int)pcVar3 - (int)pcVar2;
    if (iVar1 != 0) {
      iVar4 = iVar4 - iVar1;
      *(int *)((long)sptr + 8) = iVar4;
      if (0 < iVar4) {
        pcVar5 = pcVar2 + iVar4;
        do {
          *pcVar2 = *pcVar3;
          pcVar2 = pcVar2 + 1;
          pcVar3 = pcVar3 + 1;
        } while (pcVar2 < pcVar5);
      }
    }
  }
  der_encode_primitive(__return_storage_ptr__,td,sptr,tag_mode,tag,cb,app_key);
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
INTEGER_encode_der(asn_TYPE_descriptor_t *td, void *sptr,
	int tag_mode, ber_tlv_tag_t tag,
	asn_app_consume_bytes_f *cb, void *app_key) {
	INTEGER_t *st = (INTEGER_t *)sptr;

	ASN_DEBUG("%s %s as INTEGER (tm=%d)",
		cb?"Encoding":"Estimating", td->name, tag_mode);

	/*
	 * Canonicalize integer in the buffer.
	 * (Remove too long sign extension, remove some first 0x00 bytes)
	 */
	if(st->buf) {
		uint8_t *buf = st->buf;
		uint8_t *end1 = buf + st->size - 1;
		int shift;

		/* Compute the number of superfluous leading bytes */
		for(; buf < end1; buf++) {
			/*
			 * If the contents octets of an integer value encoding
			 * consist of more than one octet, then the bits of the
			 * first octet and bit 8 of the second octet:
			 * a) shall not all be ones; and
			 * b) shall not all be zero.
			 */
			switch(*buf) {
			case 0x00: if((buf[1] & 0x80) == 0)
					continue;
				break;
			case 0xff: if((buf[1] & 0x80))
					continue;
				break;
			}
			break;
		}

		/* Remove leading superfluous bytes from the integer */
		shift = buf - st->buf;
		if(shift) {
			uint8_t *nb = st->buf;
			uint8_t *end;

			st->size -= shift;	/* New size, minus bad bytes */
			end = nb + st->size;

			for(; nb < end; nb++, buf++)
				*nb = *buf;
		}

	} /* if(1) */

	return der_encode_primitive(td, sptr, tag_mode, tag, cb, app_key);
}